

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

UChar32 ucnv_MBCSGetNextUChar(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  UConverter *pUVar4;
  UConverterSharedData *pUVar5;
  byte *pbVar6;
  int32_t (*stateTable) [256];
  uint16_t *puVar7;
  uint uVar8;
  UBool UVar9;
  uint8_t *puVar10;
  uint uVar11;
  long lVar12;
  byte *pbVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  byte bVar19;
  uint uVar21;
  byte *pbVar22;
  uint uVar20;
  
  pUVar4 = pArgs->converter;
  if ('\0' < pUVar4->preToULength) {
    return -9;
  }
  pUVar5 = pUVar4->sharedData;
  if (((pUVar5->mbcs).unicodeMask & 2) != 0) {
    return -9;
  }
  pbVar6 = (byte *)pArgs->sourceLimit;
  stateTable = *(int32_t (**) [256])
                ((pUVar5->mbcs).sbcsIndex + (ulong)(((byte)pUVar4->options & 0x10) >> 4) * 4 + -0x18
                );
  pbVar13 = (byte *)pArgs->source;
  if ((pUVar5->mbcs).countStates != '\x01') {
    uVar14 = pUVar4->mode;
    if ((char)uVar14 == '\0') {
      uVar14 = (uint)(pUVar5->mbcs).dbcsOnlyState;
    }
    puVar7 = (pUVar5->mbcs).unicodeCodeUnits;
    uVar15 = pUVar4->toUnicodeStatus;
    uVar11 = 0xffffffff;
switchD_0032832e_caseD_3:
    pbVar22 = pbVar13;
    lVar12 = 0;
    uVar16 = uVar14;
    uVar14 = uVar11;
    while( true ) {
      uVar11 = uVar14;
      lVar18 = lVar12;
      lVar12 = lVar18;
      uVar21 = uVar16;
      if (pbVar6 <= pbVar22 + lVar18) goto LAB_00328427;
      pbVar13 = pbVar22 + lVar18 + 1;
      uVar3 = *(uint *)((long)*stateTable +
                       (ulong)pbVar22[lVar18] * 4 + (ulong)((uVar16 & 0xff) << 10));
      if ((int)uVar3 < 0) break;
      uVar16 = uVar3 >> 0x18;
      uVar15 = uVar15 + (uVar3 & 0xffffff);
      if ((pbVar13 < pbVar6) &&
         (uVar21 = *(uint *)((long)*stateTable + (ulong)*pbVar13 * 4 + (ulong)(uVar16 << 10)),
         (uVar21 & 0x80f00000) == 0x80400000)) {
        uVar2 = puVar7[(uVar21 & 0xffff) + uVar15];
        uVar11 = (uint)uVar2;
        lVar12 = lVar18 + 1;
        uVar14 = (uint)uVar2;
        if (uVar2 < 0xfffe) {
          pbVar13 = pbVar22 + lVar18 + 2;
          uVar21 = (uint)((byte)(uVar21 >> 0x18) & 0x7f);
          goto LAB_0032850e;
        }
      }
      else {
        lVar12 = lVar18 + 1;
        uVar14 = uVar11;
      }
    }
    pUVar4->mode = uVar16 & 0xff;
    bVar19 = (byte)(uVar3 >> 0x18) & 0x7f;
    uVar14 = (uint)bVar19;
    uVar21 = (uint)bVar19;
    uVar20 = (uint)bVar19;
    uVar17 = uVar3 >> 0x14 & 0xf;
    if (uVar17 == 5) {
      uVar2 = puVar7[(uVar3 & 0xffff) + uVar15];
      uVar11 = (uint)uVar2;
      pbVar13 = pbVar22 + lVar18 + 1;
      if (0xd7ff < uVar2) {
        uVar14 = (uVar3 & 0xffff) + uVar15 + 1;
        if (uVar2 < 0xe000) {
          uVar11 = (uVar2 & 0x3ff) * 0x400 + (uint)puVar7[uVar14] + 0x2400;
        }
        else if ((uVar2 & 0xfffe) == 0xe000) {
          uVar11 = (uint)puVar7[uVar14];
        }
        else {
          uVar8 = (uint)uVar2;
          if (uVar2 != 0xffff) goto switchD_0032832e_caseD_6;
LAB_003285bc:
          *pErrorCode = U_ILLEGAL_CHAR_FOUND;
          pbVar13 = pbVar22 + lVar18 + 1;
          uVar11 = 0xffff;
        }
      }
      goto LAB_0032850e;
    }
    if (uVar17 == 4) {
      uVar14 = (uVar3 & 0xffff) + uVar15;
      uVar2 = puVar7[uVar14];
      uVar11 = (uint)uVar2;
      lVar12 = lVar18 + 1;
      if (0xfffd < uVar2) {
        if (uVar2 != 0xfffe) goto LAB_003285bc;
        uVar11 = ucnv_MBCSGetFallback(&pUVar5->mbcs,uVar14);
        uVar21 = (uint)bVar19;
        uVar8 = 0xfffe;
        if (uVar11 == 0xfffe) goto switchD_0032832e_caseD_6;
        goto LAB_00328427;
      }
      pbVar13 = pbVar22 + lVar18 + 1;
      goto LAB_0032850e;
    }
    if (uVar17 != 0) {
      if ((uVar3 & 0xd00000) != 0x100000) goto code_r0x00328316;
      uVar11 = (uVar3 & 0xfffff) + 0x10000;
      pbVar13 = pbVar22 + lVar18 + 1;
      goto LAB_0032850e;
    }
    goto switchD_0032832e_caseD_2;
  }
  do {
    if (pbVar6 <= pbVar13) {
LAB_00328357:
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0xffff;
    }
    uVar14 = (*stateTable)[*pbVar13];
    pArgs->source = (char *)(pbVar13 + 1);
    if ((int)uVar14 < -0x7ff00000) break;
    if ((uVar14 & 0xd00000) == 0x100000) {
      return (uVar14 & 0xfffff) + 0x10000;
    }
    uVar11 = uVar14 >> 0x14 & 0xf;
    if (uVar11 == 7) goto LAB_00328357;
    if (uVar11 == 6) {
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        pArgs->source = (char *)pbVar13;
        return -9;
      }
      goto LAB_00328357;
    }
    pbVar13 = pbVar13 + 1;
  } while (uVar11 != 2);
  return uVar14 & 0xffff;
code_r0x00328316:
  uVar15 = 0;
  uVar8 = uVar11;
  switch(uVar17) {
  case 2:
    goto switchD_0032832e_caseD_2;
  default:
    goto switchD_0032832e_caseD_3;
  case 7:
LAB_00328416:
    *pErrorCode = U_ILLEGAL_CHAR_FOUND;
    lVar12 = lVar18 + 1;
    uVar21 = uVar20;
    break;
  case 8:
    uVar20 = uVar16;
    if ((pUVar5->mbcs).dbcsOnlyState != '\0') goto LAB_00328416;
  case 6:
switchD_0032832e_caseD_6:
    uVar11 = uVar8;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar4->toUnicodeStatus = 0;
      pUVar4->mode = uVar3 >> 0x18 & 0x7f;
      pArgs->source = (char *)pbVar22;
      return -9;
    }
    lVar12 = lVar18 + 1;
    uVar21 = (uint)bVar19;
  }
LAB_00328427:
  pbVar13 = pbVar22 + lVar12;
  if (-1 < (int)uVar11) goto LAB_0032850e;
  if (((*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) && (pbVar13 == pbVar6)) && (0 < lVar12)) {
    puVar10 = pUVar4->toUBytes;
    pUVar4->toULength = (int8_t)lVar12;
    do {
      bVar19 = *pbVar22;
      pbVar22 = pbVar22 + 1;
      *puVar10 = bVar19;
      puVar10 = puVar10 + 1;
    } while (pbVar22 < pbVar6);
    *pErrorCode = U_TRUNCATED_CHAR_FOUND;
  }
  else {
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      goto LAB_00328504;
    }
    uVar1 = (pUVar5->mbcs).dbcsOnlyState;
    pUVar4->toUBytes[0] = *pbVar22;
    if (lVar12 != 1) {
      lVar12 = 0;
      goto LAB_003284b1;
    }
    pUVar4->toULength = '\x01';
  }
  goto LAB_00328504;
LAB_003284b1:
  if (pbVar13 <= pbVar22 + lVar12 + 1) goto LAB_003284f6;
  bVar19 = pbVar22[lVar12 + 1];
  UVar9 = isSingleOrLead(stateTable,(uint8_t)uVar21,uVar1 != '\0',bVar19);
  if (UVar9 != '\0') goto LAB_003284f6;
  pUVar4->toUBytes[lVar12 + 1] = bVar19;
  lVar12 = lVar12 + 1;
  goto LAB_003284b1;
switchD_0032832e_caseD_2:
  uVar11 = uVar3 & 0xffff;
  pbVar13 = pbVar22 + lVar18 + 1;
  goto LAB_0032850e;
LAB_003284f6:
  pUVar4->toULength = (char)lVar12 + '\x01';
  pbVar13 = pbVar22 + lVar12 + 1;
LAB_00328504:
  uVar11 = 0xffff;
LAB_0032850e:
  pUVar4->toUnicodeStatus = 0;
  pUVar4->mode = uVar21 & 0xff;
  pArgs->source = (char *)pbVar13;
  return uVar11;
}

Assistant:

static UChar32 U_CALLCONV
ucnv_MBCSGetNextUChar(UConverterToUnicodeArgs *pArgs,
                  UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit, *lastSource;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;

    int32_t entry;
    UChar32 c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /* use the generic code in ucnv_getNextUChar() to continue with a partial match */
        return UCNV_GET_NEXT_UCHAR_USE_TO_U;
    }

    if(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SURROGATES) {
        /*
         * Using the generic ucnv_getNextUChar() code lets us deal correctly
         * with the rare case of a codepage that maps single surrogates
         * without adding the complexity to this already complicated function here.
         */
        return UCNV_GET_NEXT_UCHAR_USE_TO_U;
    } else if(cnv->sharedData->mbcs.countStates==1) {
        return ucnv_MBCSSingleGetNextUChar(pArgs, pErrorCode);
    }

    /* set up the local pointers */
    source=lastSource=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* conversion loop */
    c=U_SENTINEL;
    while(source<sourceLimit) {
        entry=stateTable[state][*source++];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);

            /* optimization for 1/2-byte input and BMP output */
            if( source<sourceLimit &&
                MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
            ) {
                ++source;
                state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                /* output BMP code point */
                break;
            }
        } else {
            /* save the previous state for proper extension mapping with SI/SO-stateful converters */
            cnv->mode=state;

            /* set the next state early so that we can reuse the entry variable */
            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
            if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_VALID_16) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset];
                if(c<0xfffe) {
                    /* output BMP code point */
                    break;
                } else if(c==0xfffe) {
                    if(UCNV_TO_U_USE_FALLBACK(cnv) && (c=ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                        break;
                    }
                } else {
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                    break;
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=((c&0x3ff)<<10)+unicodeCodeUnits[offset]+(0x10000-0xdc00);
                    break;
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[offset];
                    break;
                } else if(c==0xffff) {
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                      (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
            ) {
                /* output supplementary code point */
                c=(UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
                break;
            } else if(action==MBCS_STATE_CHANGE_ONLY) {
                /*
                 * This serves as a state change without any output.
                 * It is useful for reading simple stateful encodings,
                 * for example using just Shift-In/Shift-Out codes.
                 * The 21 unused bits may later be used for more sophisticated
                 * state transitions.
                 */
                if(cnv->sharedData->mbcs.dbcsOnlyState!=0) {
                    /* SI/SO are illegal for DBCS-only conversion */
                    state=(uint8_t)(cnv->mode); /* restore the previous state */

                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                }
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
                if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                    /* output BMP code point */
                    c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                    break;
                }
            } else if(action==MBCS_STATE_UNASSIGNED) {
                /* just fall through */
            } else if(action==MBCS_STATE_ILLEGAL) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            } else {
                /* reserved (must never occur), or only state change */
                offset=0;
                lastSource=source;
                continue;
            }

            /* end of action codes: prepare for a new character */
            offset=0;

            if(U_FAILURE(*pErrorCode)) {
                /* callback(illegal) */
                break;
            } else /* unassigned sequence */ {
                /* defer to the generic implementation */
                cnv->toUnicodeStatus=0;
                cnv->mode=state;
                pArgs->source=(const char *)lastSource;
                return UCNV_GET_NEXT_UCHAR_USE_TO_U;
            }
        }
    }

    if(c<0) {
        if(U_SUCCESS(*pErrorCode) && source==sourceLimit && lastSource<source) {
            /* incomplete character byte sequence */
            uint8_t *bytes=cnv->toUBytes;
            cnv->toULength=(int8_t)(source-lastSource);
            do {
                *bytes++=*lastSource++;
            } while(lastSource<source);
            *pErrorCode=U_TRUNCATED_CHAR_FOUND;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            /*
             * Ticket 5691: consistent illegal sequences:
             * - We include at least the first byte in the illegal sequence.
             * - If any of the non-initial bytes could be the start of a character,
             *   we stop the illegal sequence before the first one of those.
             */
            UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
            uint8_t *bytes=cnv->toUBytes;
            *bytes++=*lastSource++;     /* first byte */
            if(lastSource==source) {
                cnv->toULength=1;
            } else /* lastSource<source: multi-byte character */ {
                int8_t i;
                for(i=1;
                    lastSource<source && !isSingleOrLead(stateTable, state, isDBCSOnly, *lastSource);
                    ++i
                ) {
                    *bytes++=*lastSource++;
                }
                cnv->toULength=i;
                source=lastSource;
            }
        } else {
            /* no output because of empty input or only state changes */
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        }
        c=0xffff;
    }

    /* set the converter state back into UConverter, ready for a new character */
    cnv->toUnicodeStatus=0;
    cnv->mode=state;

    /* write back the updated pointer */
    pArgs->source=(const char *)source;
    return c;
}